

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O0

void __thiscall MidiOutAlsa::setPortName(MidiOutAlsa *this,string *portName)

{
  undefined4 uVar1;
  void *pvVar2;
  long lVar3;
  size_t __n;
  undefined8 uVar4;
  undefined8 uStack_40;
  void *local_38;
  void *local_30;
  void *local_28;
  snd_seq_port_info_t *pinfo;
  AlsaMidiData *data;
  string *portName_local;
  MidiOutAlsa *this_local;
  
  pinfo = (snd_seq_port_info_t *)(this->super_MidiOutApi).super_MidiApi.apiData_;
  uStack_40 = 0x113b51;
  data = (AlsaMidiData *)portName;
  portName_local = (string *)this;
  lVar3 = snd_seq_port_info_sizeof();
  lVar3 = -(lVar3 + 0xfU & 0xfffffffffffffff0);
  local_30 = (void *)((long)&local_38 + lVar3);
  local_28 = local_30;
  *(undefined8 *)((long)&uStack_40 + lVar3) = 0x113b76;
  __n = snd_seq_port_info_sizeof();
  pvVar2 = local_30;
  *(undefined8 *)((long)&uStack_40 + lVar3) = 0x113b84;
  memset(pvVar2,0,__n);
  pvVar2 = local_28;
  uVar4 = *(undefined8 *)pinfo;
  uVar1 = *(undefined4 *)(pinfo + 0xc);
  *(undefined8 *)((long)&uStack_40 + lVar3) = 0x113b9b;
  snd_seq_get_port_info(uVar4,uVar1,pvVar2);
  local_38 = local_28;
  *(undefined8 *)((long)&uStack_40 + lVar3) = 0x113bac;
  uVar4 = std::__cxx11::string::c_str();
  pvVar2 = local_38;
  *(undefined8 *)((long)&uStack_40 + lVar3) = 0x113bb8;
  snd_seq_port_info_set_name(pvVar2,uVar4);
  pvVar2 = local_28;
  uVar4 = *(undefined8 *)pinfo;
  uVar1 = *(undefined4 *)(pinfo + 0xc);
  *(undefined8 *)((long)&uStack_40 + lVar3) = 0x113bcf;
  snd_seq_set_port_info(uVar4,uVar1,pvVar2);
  return;
}

Assistant:

void MidiOutAlsa :: setPortName( const std::string &portName )
{
  AlsaMidiData *data = static_cast<AlsaMidiData *> (apiData_);
  snd_seq_port_info_t *pinfo;
  snd_seq_port_info_alloca( &pinfo );
  snd_seq_get_port_info( data->seq, data->vport, pinfo );
  snd_seq_port_info_set_name( pinfo, portName.c_str() );
  snd_seq_set_port_info( data->seq, data->vport, pinfo );
}